

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::EmitLoadConstFloat(SQCompiler *this,SQFloat value,SQInteger target)

{
  if (target < 0) {
    target = SQFuncState::PushTarget(this->_fs,-1);
  }
  SQFuncState::AddInstruction(this->_fs,_OP_LOADFLOAT,target,(long)(int)value,0,0);
  return;
}

Assistant:

void EmitLoadConstFloat(SQFloat value,SQInteger target)
    {
        if(target < 0) {
            target = _fs->PushTarget();
        }
        if(sizeof(SQFloat) == sizeof(SQInt32)) {
            _fs->AddInstruction(_OP_LOADFLOAT, target,*((SQInt32 *)&value));
        }
        else {
            _fs->AddInstruction(_OP_LOAD, target, _fs->GetNumericConstant(value));
        }
    }